

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRleCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::RleCompressor::compress(RleCompressor *this,char *inPtr,int inSize,int minY,char **outPtr)

{
  char cVar1;
  long lVar2;
  char cVar3;
  undefined1 *puVar4;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  int d;
  int p;
  uchar *stop_1;
  uchar *t;
  char *stop;
  char *t2;
  char *t1;
  char *local_48;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_18;
  int local_4;
  
  if (in_EDX == 0) {
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = 0;
  }
  else {
    local_38 = (undefined1 *)(*(long *)(in_RDI + 0x18) + (long)((in_EDX + 1) / 2));
    local_30 = *(undefined1 **)(in_RDI + 0x18);
    local_18 = in_RSI;
    while (local_18 < in_RSI + in_EDX) {
      puVar4 = local_18 + 1;
      *local_30 = *local_18;
      if (in_RSI + in_EDX <= puVar4) break;
      local_18 = local_18 + 2;
      *local_38 = *puVar4;
      local_38 = local_38 + 1;
      local_30 = local_30 + 1;
    }
    local_48 = *(char **)(in_RDI + 0x18);
    lVar2 = *(long *)(in_RDI + 0x18);
    cVar1 = *local_48;
    while (local_48 = local_48 + 1, local_48 < (char *)(lVar2 + in_EDX)) {
      cVar3 = *local_48 - cVar1;
      cVar1 = *local_48;
      *local_48 = cVar3 + -0x80;
    }
    *in_R8 = *(undefined8 *)(in_RDI + 0x20);
    local_4 = rleCompress(in_EDX,*(char **)(in_RDI + 0x18),*(char **)(in_RDI + 0x20));
  }
  return local_4;
}

Assistant:

int
RleCompressor::compress (const char *inPtr,
			 int inSize,
			 int minY,
			 const char *&outPtr)
{
    //
    // Special case �- empty input buffer
    //

    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    //
    // Reorder the pixel data.
    //

    {
	char *t1 = _tmpBuffer;
	char *t2 = _tmpBuffer + (inSize + 1) / 2;
	const char *stop = inPtr + inSize;

	while (true)
	{
	    if (inPtr < stop)
		*(t1++) = *(inPtr++);
	    else
		break;

	    if (inPtr < stop)
		*(t2++) = *(inPtr++);
	    else
		break;
	}
    }

    //
    // Predictor.
    //

    {
	unsigned char *t = (unsigned char *) _tmpBuffer + 1;
	unsigned char *stop = (unsigned char *) _tmpBuffer + inSize;
	int p = t[-1];

	while (t < stop)
	{
	    int d = int (t[0]) - p + (128 + 256);
	    p = t[0];
	    t[0] = d;
	    ++t;
	}
    }

    //
    // Run-length encode the data.
    //

    outPtr = _outBuffer;
    return rleCompress (inSize, _tmpBuffer, (signed char *) _outBuffer);
}